

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> *
libtorrent::anon_unknown_40::convert_file_storage
          (vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
           *__return_storage_ptr__,file_storage *fs)

{
  bool bVar1;
  int iVar2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  string *__args_4;
  int64_t sz;
  time_t ts;
  string local_1a0;
  int local_17c;
  int local_178;
  file_flags_t local_171;
  int local_170;
  allocator<char> local_169;
  string local_168;
  file_index_t local_144;
  string local_140;
  create_file_entry local_120;
  int local_c8;
  int local_c4;
  time_t local_c0;
  int local_b8;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_b1;
  int local_b0;
  allocator<char> local_a9;
  string local_a8;
  file_index_t local_84;
  string local_80;
  uchar local_5d;
  int local_5c;
  uchar local_56;
  bitfield_flag local_55;
  file_index_t local_54;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_50;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_44;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range2;
  file_storage *fs_local;
  vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> *ret;
  
  ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
  vector(__return_storage_ptr__);
  iVar2 = file_storage::num_files(fs);
  ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
  reserve(__return_storage_ptr__,(long)iVar2);
  ___end2 = file_storage::file_range(fs);
  local_44 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                      *)&__end2);
  rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
        end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             *)&__end2);
  while( true ) {
    i = local_44.m_idx.m_val;
    local_50 = rhs.m_idx.m_val;
    bVar1 = libtorrent::operator!=(local_44,rhs);
    if (!bVar1) break;
    local_5c = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                    ::operator*(&local_44);
    local_54.m_val = local_5c;
    local_56 = (uchar)file_storage::file_flags(fs,(file_index_t)local_5c);
    local_5d = '\b';
    local_55 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)local_56,
                          (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\b');
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_55);
    if (bVar1) {
      local_84.m_val = local_54.m_val;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
      file_storage::file_path(&local_80,fs,local_84,&local_a8);
      local_b0 = 0;
      local_b8 = local_54.m_val;
      local_b1.m_val = (uchar)file_storage::file_flags(fs,local_54);
      local_c4 = local_54.m_val;
      local_c0 = file_storage::mtime(fs,local_54);
      local_c8 = local_54.m_val;
      __args_4 = file_storage::internal_symlink_abi_cxx11_(fs,local_54);
      ::std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>::
      emplace_back<std::__cxx11::string,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_flags_tag,void>,long,std::__cxx11::string_const&>
                ((vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>
                  *)__return_storage_ptr__,&local_80,&local_b0,&local_b1,&local_c0,__args_4);
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::allocator<char>::~allocator(&local_a9);
    }
    else {
      local_144.m_val = local_54.m_val;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
      file_storage::file_path(&local_140,fs,local_144,&local_168);
      local_170 = local_54.m_val;
      sz = file_storage::file_size(fs,local_54);
      local_178 = local_54.m_val;
      local_171 = file_storage::file_flags(fs,local_54);
      local_17c = local_54.m_val;
      ts = file_storage::mtime(fs,local_54);
      ::std::__cxx11::string::string((string *)&local_1a0);
      create_file_entry::create_file_entry(&local_120,&local_140,sz,local_171,ts,&local_1a0);
      ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
      push_back(__return_storage_ptr__,&local_120);
      create_file_entry::~create_file_entry(&local_120);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      ::std::__cxx11::string::~string((string *)&local_140);
      ::std::__cxx11::string::~string((string *)&local_168);
      ::std::allocator<char>::~allocator(&local_169);
    }
    index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
    operator++(&local_44);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<create_file_entry> convert_file_storage(file_storage const& fs)
	{
		std::vector<create_file_entry> ret;
		ret.reserve(static_cast<std::size_t>(fs.num_files()));
		for (auto const i : fs.file_range())
		{
			if (fs.file_flags(i) & file_storage::flag_symlink)
				ret.emplace_back(fs.file_path(i), 0, fs.file_flags(i), fs.mtime(i), fs.internal_symlink(i));
			else
				ret.push_back({fs.file_path(i), fs.file_size(i), fs.file_flags(i), fs.mtime(i), {}});
		}
		return ret;
	}